

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  bool bVar2;
  int *piVar3;
  Allocator *pAVar4;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  undefined3 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  _func_int **pp_Var11;
  Layer *pLVar12;
  int iVar13;
  uint outch;
  char cVar14;
  byte bVar15;
  uint inch;
  Mat *weight_data;
  int iVar17;
  uint uVar18;
  Option *opt_00;
  int iVar19;
  uint kernel_h;
  byte bVar20;
  _func_int *p_Var21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  bool bVar26;
  byte bVar27;
  ParamDict pd_5;
  ParamDict pd;
  undefined1 local_c8 [8];
  int local_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  size_t sStack_a8;
  int local_a0 [2];
  size_t local_98 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  size_t local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  size_t sStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_40;
  Option *pOVar16;
  
  pp_Var11 = this->_vptr_Convolution_x86_avx512;
  p_Var21 = pp_Var11[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var21) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var21 + 4))) {
  case 1:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var21));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var21));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var21) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 5:
    pLVar12 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  case 6:
    pLVar12 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var21));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var21) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&pd);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_001c8d9d;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
  pp_Var11 = this->_vptr_Convolution_x86_avx512;
LAB_001c8d9d:
  this->activation = pLVar12;
  p_Var21 = pp_Var11[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var21) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  outch = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
  uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
  opt_00 = (Option *)(ulong)uVar18;
  kernel_h = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
  uVar7 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var21) /
          (long)(int)(kernel_h * uVar18);
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)(int)outch;
  pOVar16 = (Option *)(uVar7 & 0xffffffff);
  inch = (uint)uVar7;
  bVar25 = opt->use_packing_layout;
  if ((((uVar18 == kernel_h && (bool)bVar25 == false) &&
       (iVar17 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21), iVar17 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == iVar17)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) {
    pLVar12 = create_layer(6);
    this->convolution_dilation1 = pLVar12;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var11 = this->_vptr_Convolution_x86_avx512;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var11[-3]) == 0) {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_c8 = SUB128(ZEXT812(0),4);
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      local_a0[0] = 0;
      p_Var21 = pp_Var11[-3];
      iStack_ac = pd.d._4_4_;
      sStack_a8 = (size_t)local_c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var21)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
        uVar9 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
        pd.d._0_4_ = (undefined4)uVar9;
        pd.d._4_4_ = (int)((ulong)uVar9 >> 0x20);
        local_c8 = *(undefined1 (*) [8])
                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var21);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var21);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var21);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var21);
        sStack_a8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var21);
        iStack_b0 = (int)uVar9;
        iStack_ac = (int)((ulong)uVar9 >> 0x20);
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var21);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var21);
      }
      pLVar12 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_c8 = SUB128(ZEXT812(0),4);
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      local_a0[0] = 0;
      p_Var21 = pp_Var11[-3];
      iStack_ac = pd.d._4_4_;
      sStack_a8 = (size_t)local_c8;
      sStack_60 = (size_t)local_c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var21)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
        uVar9 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
        pd.d._0_4_ = (undefined4)uVar9;
        pd.d._4_4_ = (int)((ulong)uVar9 >> 0x20);
        local_c8 = *(undefined1 (*) [8])
                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var21);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var21);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var21);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var21);
        sStack_a8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var21);
        iStack_b0 = (int)uVar9;
        iStack_ac = (int)((ulong)uVar9 >> 0x20);
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var21);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var21);
        p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      }
      local_50 = 0;
      local_58 = 0;
      uStack_64 = 0;
      uStack_68 = 0;
      local_70 = 0;
      local_78 = 0;
      uStack_84 = 0;
      uStack_88 = 0;
      local_98[1] = 0;
      local_80 = sStack_60;
      if ((_func_int *)(local_98 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var21)) {
        piVar3 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var21);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_98[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var21);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var21);
        uStack_88 = (undefined4)uVar9;
        uStack_84 = (undefined4)((ulong)uVar9 >> 0x20);
        local_80 = *(size_t *)((long)&(this->scale_in_data).c + (long)p_Var21);
        local_78 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var21);
        local_70 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var21);
        sStack_60 = *(size_t *)(&this->field_0x1d8 + (long)p_Var21);
        uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var21);
        uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var21) >> 0x20)
        ;
        local_58 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var21);
        local_50 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var21);
      }
      pLVar12 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      lVar22 = 0x48;
      do {
        piVar3 = *(int **)((long)&pd.d + lVar22);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = *(void **)((long)&pd._vptr_ParamDict + lVar22);
            if (*(long **)((long)&local_b8 + lVar22) == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_b8 + lVar22) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_98 + lVar22) = 0;
        *(undefined8 *)((long)&pd.d + lVar22 + 4) = 0;
        *(undefined8 *)(local_c8 + lVar22 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar22) = 0;
        *(undefined8 *)((long)&pd.d + lVar22) = 0;
        *(undefined8 *)((long)&iStack_b0 + lVar22) = 0;
        *(undefined8 *)((long)local_a0 + lVar22 + -8) = 0;
        *(undefined4 *)((long)local_a0 + lVar22) = 0;
        lVar22 = lVar22 + -0x48;
      } while (lVar22 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar5 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
          plVar6 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var21);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var21) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var21) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var21 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var21) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var21) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var21) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var21) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var21) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  if ((bool)bVar25 == false) {
LAB_001c95df:
    bVar20 = bVar25 ^ 1;
    bVar26 = false;
    bVar27 = bVar20;
LAB_001c95ef:
    if ((bVar25 != 0) && (bVar27 != 0)) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
      if (iVar17 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 2))))))))
        goto LAB_001c9726;
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar17 = 3;
        iVar19 = 3;
      }
      else {
        if (((iVar17 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))) {
          iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
          iVar17 = 1;
          iVar19 = 1;
LAB_001c97c4:
          convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,iVar13,iVar17,iVar19);
          goto LAB_001c97f5;
        }
LAB_001c9726:
        iVar13 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21);
        if (iVar13 == 1) {
          iVar13 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
          if (iVar13 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)) &&
                ((0xb < (int)inch ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21))) &&
                ((0xf < (int)inch ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21)))))))
            goto LAB_001c978e;
          }
          else {
LAB_001c9784:
            if (1 < iVar13) goto LAB_001c9789;
          }
        }
        else {
          if (iVar13 < 2) {
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
            goto LAB_001c9784;
          }
LAB_001c9789:
          if ((int)inch < 0x10) {
            bVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21) < 0x10;
          }
          else {
LAB_001c978e:
            bVar24 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar24)) {
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
            goto LAB_001c97c4;
          }
        }
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_data_tm,inch,iVar13,iVar17,iVar19,1,4);
    }
LAB_001c97f5:
    if ((bVar26 & bVar20) == 1) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
      if (((uVar18 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)
                  ))) || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) ==
                             1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var21) == 1)) &&
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var21 + 4)) == 2)) &&
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2
                          )))))) {
        iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        uVar18 = 1;
        iVar13 = 1;
LAB_001c998f:
        convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                   &this->weight_sgemm_data,inch,iVar17,uVar18,iVar13);
      }
      else if (((opt->use_winograd_convolution == true) && (uVar18 == 3)) &&
              ((opt->use_winograd63_convolution != false &&
               ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 3 &&
                  (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1)) &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
                ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1))))))
              )) {
        conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                   &this->weight_winograd63_data,inch,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),
                   (Option *)(ulong)uVar18);
      }
      else {
        iVar17 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21);
        if (iVar17 == 1) {
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
          if (iVar17 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)) &&
                ((0xb < (int)inch ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21))) &&
                ((0xf < (int)inch ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21)))))))
            goto LAB_001c9959;
          }
          else {
LAB_001c994f:
            if (1 < iVar17) goto LAB_001c9954;
          }
        }
        else {
          if (iVar17 < 2) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
            goto LAB_001c994f;
          }
LAB_001c9954:
          if ((int)inch < 0x10) {
            bVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21) < 0x10;
          }
          else {
LAB_001c9959:
            bVar24 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar24)) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
            goto LAB_001c998f;
          }
        }
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                   &this->weight_data_tm,inch,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),uVar18,
                   *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21),4,1);
      }
    }
    if ((bVar20 & bVar27) != 1) goto LAB_001ca63a;
    p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
    uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
    if (((uVar18 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1))
       && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
            (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))) {
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
      uVar18 = 1;
      iVar13 = 1;
    }
    else {
      if (opt->use_winograd_convolution == true) {
        bVar25 = opt->use_winograd23_convolution;
        if ((bool)bVar25 == false) {
          if ((uVar18 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_001c9a83;
        }
        else if (uVar18 == 3) {
LAB_001c9a83:
          if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 3) &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            if ((opt->use_winograd43_convolution == true) && (0xf < (int)inch)) {
              bVar25 = iVar17 < 0x10 & bVar25;
            }
            if (bVar25 == 0) {
              conv3x3s1_winograd43_transform_kernel_sse
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_winograd43_data,inch,iVar17,(Option *)(ulong)uVar18);
            }
            else {
              conv3x3s1_winograd23_transform_kernel_sse
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_winograd23_data,inch,iVar17,(Option *)(ulong)uVar18);
            }
            goto LAB_001ca63a;
          }
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var21 != (_func_int *)0xfffffffffffffeb0) {
          piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (this->weight_data_tm).refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar5 = (this->weight_data_tm).data;
              pAVar4 = (this->weight_data_tm).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          (this->weight_data_tm).c = 0;
          p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
          piVar3 = *(int **)(p_Var1 + 8);
          (this->weight_data_tm).data = *(void **)p_Var1;
          (this->weight_data_tm).refcount = piVar3;
          (this->weight_data_tm).elemsize =
               *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var21);
          (this->weight_data_tm).elempack =
               *(int *)((long)&this->convolution_dilation1 + (long)p_Var21);
          (this->weight_data_tm).allocator =
               *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var21);
          p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var21);
          uVar9 = *(undefined8 *)p_Var1;
          uVar10 = *(undefined8 *)(p_Var1 + 8);
          (this->weight_data_tm).dims = (int)uVar9;
          (this->weight_data_tm).w = (int)((ulong)uVar9 >> 0x20);
          (this->weight_data_tm).h = (int)uVar10;
          (this->weight_data_tm).d = (int)((ulong)uVar10 >> 0x20);
          (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var21)
          ;
          (this->weight_data_tm).cstep =
               *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var21);
        }
        goto LAB_001ca63a;
      }
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
      iVar13 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
    }
    convolution_im2col_sgemm_transform_kernel_sse
              ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
               &this->weight_sgemm_data,inch,iVar17,uVar18,iVar13);
    goto LAB_001ca63a;
  }
  if ((uVar7 & 0xf) == 0) {
    cVar14 = '\x10';
LAB_001c9054:
    if ((outch & 0xf) == 0) {
      if (cVar14 == '\x04') {
        if ((kernel_h == 1 && uVar18 == 1) &&
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))) {
          uVar18 = 1;
          kernel_h = 1;
        }
        else {
          weight_data = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
          if (opt->use_sgemm_convolution != true) {
            iVar13 = 0x10;
            iVar17 = 4;
            goto LAB_001ca631;
          }
        }
        convolution_im2col_sgemm_transform_kernel_pack4to16_avx512
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                   &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
        goto LAB_001ca63a;
      }
      if (cVar14 == '\x10') {
        if (((kernel_h == 1 && uVar18 == 1) &&
            (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1)) &&
           (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
            ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
          uVar18 = 1;
          kernel_h = 1;
LAB_001ca047:
          convolution_im2col_sgemm_transform_kernel_pack16_avx512
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
        }
        else if (opt->use_winograd_convolution == true) {
          bVar24 = opt->use_winograd23_convolution;
          if ((bVar24 == false) && (opt->use_winograd43_convolution == false)) {
            if ((kernel_h == 3) && ((uVar18 == 3 && (opt->use_winograd63_convolution != false))))
            goto LAB_001c9fae;
            goto LAB_001ca033;
          }
          if (kernel_h != 3 || uVar18 != 3) goto LAB_001ca033;
LAB_001c9fae:
          if ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1) ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1))
          goto LAB_001ca033;
          if (((opt->use_winograd63_convolution == true) && (0x1f < (int)inch)) &&
             ((outch - 0x20 < 0x61 && (inch < 0x81)))) {
LAB_001cac21:
            conv3x3s1_winograd63_transform_kernel_pack16_avx512
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_winograd63_data,inch,outch,opt_00);
          }
          else {
            if (opt->use_winograd43_convolution == false) {
              if (bVar24 != false) goto LAB_001cac07;
              goto LAB_001cac21;
            }
            bVar26 = 0x1f < (int)outch;
            uVar8 = (undefined3)(uVar18 >> 8);
            opt_00 = (Option *)(ulong)CONCAT31(uVar8,bVar26);
            if (((bVar24 | opt->use_winograd63_convolution) != 1) ||
               (opt_00 = (Option *)(ulong)CONCAT31(uVar8,bVar26 && 0x1f < (int)inch),
               bVar26 && 0x1f < (int)inch)) {
              conv3x3s1_winograd43_transform_kernel_pack16_avx512
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_winograd43_data,inch,outch,opt_00);
            }
            else {
LAB_001cac07:
              conv3x3s1_winograd23_transform_kernel_pack16_avx512
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_winograd23_data,inch,outch,opt_00);
            }
          }
        }
        else {
LAB_001ca033:
          if (opt->use_sgemm_convolution == true) goto LAB_001ca047;
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,outch,uVar18,kernel_h,0x10,0x10);
        }
        cVar14 = '\x10';
        bVar24 = false;
        goto LAB_001ca071;
      }
      bVar2 = true;
      bVar24 = false;
      bVar25 = 0;
      bVar26 = false;
    }
    else {
      if ((outch & 7) != 0) {
        bVar24 = (outch & 3) == 0;
        if ((bVar24) && (cVar14 == '\x10')) {
          if ((kernel_h == 1 && uVar18 == 1) &&
             (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1))
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)) ||
              (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
                (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
            uVar18 = 1;
            kernel_h = 1;
          }
          else if (opt->use_sgemm_convolution != true) {
            convolution_transform_kernel_packed_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_data_tm,inch,outch,uVar18,kernel_h,0x10,4);
            goto LAB_001c95df;
          }
          convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
          goto LAB_001c95df;
        }
        bVar20 = (outch & 3) != 0;
        bVar26 = cVar14 == '\x04';
        bVar27 = cVar14 == '\x01';
        bVar15 = 0;
        bVar25 = bVar24;
        if ((cVar14 != '\x10') || (bVar15 = 0, !(bool)bVar20)) goto LAB_001c9321;
        if (uVar18 != 3) {
          if (((uVar18 == 1) && (kernel_h == 1)) &&
             (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1))
                && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
              ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2))
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))) {
            uVar18 = 1;
            kernel_h = 1;
          }
          else {
LAB_001c9e67:
            if (opt->use_sgemm_convolution != true) goto LAB_001c9e87;
          }
          convolution_im2col_sgemm_transform_kernel_pack16to1_avx512
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
          goto LAB_001ca63a;
        }
        if ((((kernel_h != 3) ||
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1)) ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1 ||
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1))))
        goto LAB_001c9e67;
        if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
          conv3x3s1_winograd63_transform_kernel_pack16to1_avx512
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_winograd63_data,inch,outch,opt_00);
          goto LAB_001ca63a;
        }
        uVar18 = 3;
        kernel_h = 3;
LAB_001c9e87:
        weight_data = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
        iVar13 = 1;
        iVar17 = 0x10;
        goto LAB_001ca631;
      }
      bVar24 = true;
      if (cVar14 == '\x10') {
        if ((kernel_h == 1 && uVar18 == 1) &&
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)) ||
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
          uVar18 = 1;
          kernel_h = 1;
LAB_001c956c:
          convolution_im2col_sgemm_transform_kernel_pack16to8_avx512
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
        }
        else {
          if (opt->use_sgemm_convolution == true) goto LAB_001c956c;
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,outch,uVar18,kernel_h,0x10,8);
        }
        cVar14 = '\x10';
      }
LAB_001ca071:
      bVar25 = 0;
LAB_001ca074:
      bVar2 = (bool)(bVar24 ^ 1);
      bVar26 = cVar14 == '\x04';
    }
    if ((bVar2) && (cVar14 == '\x01')) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
      if (((iVar17 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1))
                || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1))
                     && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4))
                         == 2)) &&
                    (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2))))))
      {
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar17 = 1;
        iVar19 = 1;
      }
      else {
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,iVar13,iVar17,iVar19,1,0x10);
          goto LAB_001ca167;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to16_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_sgemm_data,inch,iVar13,iVar17,iVar19);
    }
LAB_001ca167:
    if ((bool)(bVar25 & bVar24)) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
      if (((iVar17 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)
                  ))) || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) ==
                            1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                          (long)p_Var21) == 1)) &&
                          ((*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var21 + 4)) == 2 &&
                           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) ==
                            2)))))))) {
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar17 = 1;
        iVar19 = 1;
      }
      else {
        if ((opt->use_winograd_convolution == true) &&
           (((bVar2 = opt->use_winograd23_convolution, bVar2 != false ||
             (opt->use_winograd43_convolution != false)) ||
            (opt->use_winograd63_convolution == true)))) {
          if (iVar17 != 2) {
            if ((iVar17 != 3) ||
               (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) != 3))
            goto LAB_001ca39a;
            if ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1) ||
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1))
                || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1)))) {
LAB_001ca2dd:
              if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1) ||
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
                 ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1
                  || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1))))
              goto LAB_001ca39a;
              iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
              iVar13 = 3;
              iVar19 = 3;
              goto LAB_001ca388;
            }
            if ((int)inch < 9) {
              if (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21) < 9)
              goto LAB_001ca2dd;
              if (opt->use_winograd43_convolution == false) goto LAB_001caceb;
              bVar25 = opt->use_winograd63_convolution;
LAB_001cad13:
              if (bVar25 == 0 && bVar2 == false) {
                iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
LAB_001cad41:
                conv3x3s1_winograd43_transform_kernel_pack8_avx
                          ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                           &this->weight_winograd43_data,inch,iVar17,pOVar16);
                goto LAB_001ca3e6;
              }
            }
            else {
              bVar25 = opt->use_winograd63_convolution;
              bVar23 = 0xf < inch;
              if (((bool)bVar25 == true) && (0xf < inch)) {
                iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
                bVar23 = true;
                if (0x30 < iVar17 - 0x10U) {
                  bVar25 = 1;
                  goto LAB_001cacc9;
                }
                bVar25 = 1;
                if (0x40 < inch) goto LAB_001cacc9;
LAB_001cacf5:
                conv3x3s1_winograd63_transform_kernel_pack8_avx
                          ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                           &this->weight_winograd63_data,inch,iVar17,pOVar16);
                goto LAB_001ca3e6;
              }
LAB_001cacc9:
              if (opt->use_winograd43_convolution == false) {
LAB_001caceb:
                if (bVar2 == false) {
                  iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
                  goto LAB_001cacf5;
                }
              }
              else {
                if (!bVar23) goto LAB_001cad13;
                iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
                if ((iVar17 < 0x10 & (bVar25 | bVar2)) == 0) goto LAB_001cad41;
              }
            }
            conv3x3s1_winograd23_transform_kernel_pack8_avx
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_winograd23_data,inch,
                       *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),pOVar16);
            goto LAB_001ca3e6;
          }
LAB_001ca337:
          if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 2) &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            iVar13 = 2;
            iVar19 = 2;
LAB_001ca388:
            convolution_transform_kernel_packed_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_data_tm,inch,iVar17,iVar13,iVar19,8,8);
            goto LAB_001ca3e6;
          }
        }
        else {
          if (iVar17 == 2) goto LAB_001ca337;
          if ((iVar17 == 3) &&
             (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 3))
          goto LAB_001ca2dd;
        }
LAB_001ca39a:
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,iVar13,iVar17,iVar19,8,8);
          goto LAB_001ca3e6;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_sgemm_data,inch,iVar13,iVar17,iVar19);
    }
LAB_001ca3e6:
    if ((bool)(bVar26 & bVar24)) {
      p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
      if (((iVar17 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)
          ) && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)
                  ))) || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) ==
                             1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var21) == 1)) &&
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var21 + 4)) == 2)) &&
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2
                          )))))) {
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar17 = 1;
        iVar19 = 1;
      }
      else {
        iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,iVar13,iVar17,iVar19,4,8);
          goto LAB_001ca4c4;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_sgemm_data,inch,iVar13,iVar17,iVar19);
    }
LAB_001ca4c4:
    if (!bVar24 || cVar14 != '\x01') goto LAB_001ca63a;
    p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
    uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
    if (uVar18 != 3) {
      if (((uVar18 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)
          ) && ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                  ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                   )))) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) ==
                            1)) ||
                ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))
                ))) {
        outch = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        uVar18 = 1;
        kernel_h = 1;
      }
      else {
LAB_001ca5f9:
        outch = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
        kernel_h = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
        if (opt->use_sgemm_convolution != true) goto LAB_001ca62d;
      }
      convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
      goto LAB_001ca63a;
    }
    if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) != 3) ||
       ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1 ||
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1 ||
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1)))) &&
        ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1 ||
           (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1)) ||
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 2)) ||
         (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 2))))))
    goto LAB_001ca5f9;
    outch = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
    uVar18 = 3;
    kernel_h = 3;
LAB_001ca62d:
    weight_data = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
    iVar13 = 8;
    iVar17 = 1;
  }
  else {
    if ((uVar7 & 7) != 0) {
      cVar14 = ((uVar7 & 3) == 0) * '\x03' + '\x01';
      goto LAB_001c9054;
    }
    if ((outch & 0xf) != 0) {
      if ((outch & 7) != 0) {
        bVar25 = (outch & 3) == 0;
        bVar20 = !(bool)bVar25;
        bVar15 = 1;
        bVar26 = false;
        bVar27 = false;
LAB_001c9321:
        if ((bVar25 & bVar15) == 1) {
          p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
          if (((iVar17 == 1) &&
              (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)) &&
             (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1))
                && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
              (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
                (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            iVar17 = 1;
            iVar19 = 1;
          }
          else {
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            iVar19 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
            if (opt->use_sgemm_convolution != true) {
              convolution_transform_kernel_packed_sse
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_data_tm,inch,iVar13,iVar17,iVar19,8,4);
              goto LAB_001c9bdc;
            }
          }
          convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,iVar13,iVar17,iVar19);
        }
LAB_001c9bdc:
        if ((bVar15 & bVar20) == 1) {
          p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
          uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
          if (uVar18 == 3) {
            if (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) != 3) ||
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) != 1)) ||
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) != 1 ||
                ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) != 1
                 || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) != 1))))))
            goto LAB_001c9cfd;
            if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)
               ) {
              conv3x3s1_winograd63_transform_kernel_pack8to1_avx
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                         &this->weight_winograd63_data,inch,
                         *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),
                         (Option *)(ulong)uVar18);
              goto LAB_001c9d43;
            }
            iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
            uVar18 = 3;
            iVar17 = 3;
LAB_001c9d31:
            convolution_transform_kernel_packed_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_data_tm,inch,iVar13,uVar18,iVar17,8,1);
          }
          else {
            if (((uVar18 == 1) &&
                (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)) &&
               (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1
                   )) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)
                  ))) || ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) ==
                             1 && (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var21) == 1)) &&
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var21 + 4)) == 2)) &&
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2
                          )))))) {
              iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
              uVar18 = 1;
              iVar17 = 1;
            }
            else {
LAB_001c9cfd:
              iVar13 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
              iVar17 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
              if (opt->use_sgemm_convolution != true) goto LAB_001c9d31;
            }
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                       &this->weight_sgemm_data,inch,iVar13,uVar18,iVar17);
          }
        }
LAB_001c9d43:
        if ((bVar25 & bVar26) != 1) goto LAB_001c95ef;
        p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
        uVar18 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var21);
        pOVar16 = (Option *)(ulong)uVar18;
        if (((uVar18 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
          uVar18 = 1;
          iVar13 = 1;
LAB_001ca7f7:
          convolution_im2col_sgemm_transform_kernel_pack4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_sgemm_data,inch,iVar17,uVar18,iVar13);
        }
        else {
          if (opt->use_winograd_convolution == true) {
            bVar24 = opt->use_winograd23_convolution;
            if ((bVar24 == false) && (opt->use_winograd43_convolution == false)) {
              if ((uVar18 == 3) && (opt->use_winograd63_convolution != false)) {
LAB_001ca6d5:
                if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21) == 3) &&
                   ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
                      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1))
                     && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4))
                         == 1)) &&
                    (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) {
                  bVar2 = opt->use_winograd63_convolution;
                  if ((((bVar2 != true) || ((int)inch < 8)) ||
                      (iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),
                      0x18 < iVar17 - 8U)) || (0x20 < inch)) {
                    if (opt->use_winograd43_convolution != false) {
                      if ((int)inch < 8) {
                        if (bVar24 == false && bVar2 == false) {
                          iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21)
                          ;
                          goto LAB_001cacad;
                        }
                      }
                      else {
                        iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
                        if (((bVar24 | bVar2) != 1) || (7 < iVar17)) {
LAB_001cacad:
                          conv3x3s1_winograd43_transform_kernel_pack4_sse
                                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21
                                            ),&this->weight_winograd43_data,inch,iVar17,pOVar16);
                          goto LAB_001c95ef;
                        }
                      }
LAB_001cac87:
                      conv3x3s1_winograd23_transform_kernel_pack4_sse
                                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                                 &this->weight_winograd23_data,inch,
                                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),
                                 pOVar16);
                      goto LAB_001c95ef;
                    }
                    if (bVar24 != false) goto LAB_001cac87;
                    iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
                  }
                  conv3x3s1_winograd63_transform_kernel_pack4_sse
                            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                             &this->weight_winograd63_data,inch,iVar17,pOVar16);
                  goto LAB_001c95ef;
                }
              }
            }
            else if (uVar18 == 3) goto LAB_001ca6d5;
          }
          iVar17 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21);
          if (iVar17 == 1) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
            if (iVar17 == 1) {
              if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) ==
                     1) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) ==
                            1)) &&
                  ((0xb < (int)inch ||
                   (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21))))) ||
                 (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4))
                   || (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21))) &&
                  ((0xf < (int)inch ||
                   (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21)))))))
              goto LAB_001ca7c1;
            }
            else {
LAB_001ca7b7:
              if (1 < iVar17) goto LAB_001ca7bc;
            }
          }
          else {
            if (iVar17 < 2) {
              iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21);
              goto LAB_001ca7b7;
            }
LAB_001ca7bc:
            if ((int)inch < 0x10) {
              bVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21) < 0x10;
            }
            else {
LAB_001ca7c1:
              bVar24 = false;
            }
            if ((opt->use_sgemm_convolution == true) && (!bVar24)) {
              iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21);
              iVar13 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21);
              goto LAB_001ca7f7;
            }
          }
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                     &this->weight_data_tm,inch,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var21),uVar18,
                     *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var21),4,4);
        }
        goto LAB_001c95ef;
      }
      cVar14 = '\b';
      bVar24 = true;
      bVar25 = 1;
      goto LAB_001ca074;
    }
    if ((kernel_h == 1 && uVar18 == 1) &&
       ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 1 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 1)))) ||
        (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var21) == 1 &&
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var21) == 1)) &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var21 + 4)) == 2 &&
          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var21) == 2)))))))) {
      uVar18 = 1;
      kernel_h = 1;
LAB_001c958e:
      convolution_im2col_sgemm_transform_kernel_pack8to16_avx512
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21),
                 &this->weight_sgemm_data,inch,outch,uVar18,kernel_h);
      goto LAB_001ca63a;
    }
    weight_data = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
    if (opt->use_sgemm_convolution == true) goto LAB_001c958e;
    iVar13 = 0x10;
    iVar17 = 8;
  }
LAB_001ca631:
  convolution_transform_kernel_packed_sse
            (weight_data,&this->weight_data_tm,inch,outch,uVar18,kernel_h,iVar17,iVar13);
LAB_001ca63a:
  if (opt->lightmode == true) {
    p_Var21 = this->_vptr_Convolution_x86_avx512[-3];
    piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var21);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar5 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var21);
        plVar6 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var21);
        if (plVar6 == (long *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var21) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var21) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var21 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var21) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var21) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var21) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var21) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var21) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}